

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlFloat::ReadData(EbmlFloat *this,IOCallback *input,ScopeMode ReadFully)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float *pfVar2;
  undefined4 extraout_var_02;
  double *pdVar3;
  undefined4 extraout_var_03;
  double val_1;
  int64 tmpp_1;
  big_int64 TmpRead_1;
  float val;
  int32 tmpp;
  big_int32 TmpRead;
  binary Buffer [20];
  ScopeMode ReadFully_local;
  IOCallback *input_local;
  EbmlFloat *this_local;
  
  if (ReadFully != SCOPE_NO_DATA) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    if (0x14 < CONCAT44(extraout_var,iVar1)) {
      __assert_fail("GetSize() <= 20",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                    ,0x7c,"virtual filepos_t libebml::EbmlFloat::ReadData(IOCallback &, ScopeMode)")
      ;
    }
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    IOCallback::readFully(input,&TmpRead,CONCAT44(extraout_var_00,iVar1));
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    if (CONCAT44(extraout_var_01,iVar1) == 4) {
      Endian<int,_(libebml::endianess)0>::Endian((Endian<int,_(libebml::endianess)0> *)&val);
      Endian<int,_(libebml::endianess)0>::Eval
                ((Endian<int,_(libebml::endianess)0> *)&val,(binary *)&TmpRead);
      pfVar2 = (float *)Endian::operator_cast_to_int_((Endian *)&val);
      TmpRead_1.endian_value._0_4_ = *pfVar2;
      this->Value = (double)(float)TmpRead_1.endian_value;
      TmpRead_1.endian_value._4_4_ = (float)TmpRead_1.endian_value;
      EbmlElement::SetValueIsSet(&this->super_EbmlElement,true);
    }
    else {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      if (CONCAT44(extraout_var_02,iVar1) == 8) {
        Endian<long,_(libebml::endianess)0>::Endian((Endian<long,_(libebml::endianess)0> *)&tmpp_1);
        Endian<long,_(libebml::endianess)0>::Eval
                  ((Endian<long,_(libebml::endianess)0> *)&tmpp_1,(binary *)&TmpRead);
        pdVar3 = (double *)Endian::operator_cast_to_long_((Endian *)&tmpp_1);
        this->Value = *pdVar3;
        EbmlElement::SetValueIsSet(&this->super_EbmlElement,true);
      }
    }
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
  return CONCAT44(extraout_var_03,iVar1);
}

Assistant:

filepos_t EbmlFloat::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[20];
    assert(GetSize() <= 20);
    input.readFully(Buffer, GetSize());

    if (GetSize() == 4) {
      big_int32 TmpRead;
      TmpRead.Eval(Buffer);
      int32 tmpp = int32(TmpRead);
      float val;
      memcpy(&val, &tmpp, 4);
      Value = val;
      SetValueIsSet();
    } else if (GetSize() == 8) {
      big_int64 TmpRead;
      TmpRead.Eval(Buffer);
      int64 tmpp = int64(TmpRead);
      double val;
      memcpy(&val, &tmpp, 8);
      Value = val;
      SetValueIsSet();
    }
  }

  return GetSize();
}